

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O1

int webm_read_frame(WebmInputContext *webm_ctx,uint8_t **buffer,size_t *bytes_read,
                   size_t *buffer_size)

{
  size_t *psVar1;
  uint8_t **ppuVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  longlong lVar7;
  Cluster *pCurr;
  Block *this;
  Frame *this_00;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  BlockEntry *block_entry;
  BlockEntry *local_60;
  int local_54;
  size_t *local_50;
  size_t *local_48;
  uint8_t **local_40;
  Segment *local_38;
  undefined4 extraout_var;
  
  iVar5 = 1;
  if (webm_ctx->reached_eos == 0) {
    local_38 = (Segment *)webm_ctx->segment;
    pCurr = (Cluster *)webm_ctx->cluster;
    this = (Block *)webm_ctx->block;
    local_60 = (BlockEntry *)webm_ctx->block_entry;
    bVar4 = false;
    local_50 = bytes_read;
    local_48 = buffer_size;
    local_40 = buffer;
    do {
      if ((local_60 != (BlockEntry *)0x0) || (bVar4)) {
        if ((bVar4) || (iVar5 = (*local_60->_vptr_BlockEntry[3])(), iVar5 == 0)) {
          pCurr = mkvparser::Segment::GetNext(local_38,pCurr);
          if ((pCurr != (Cluster *)0x0) && (bVar3 = mkvparser::Cluster::EOS(pCurr), !bVar3)) {
            bVar4 = false;
            goto LAB_001240a8;
          }
          *local_50 = 0;
          webm_ctx->reached_eos = 1;
          iVar5 = 1;
          local_54 = 1;
        }
        else {
          if (((this != (Block *)0x0) &&
              (iVar5 = webm_ctx->block_frame_index, iVar6 = mkvparser::Block::GetFrameCount(this),
              iVar5 != iVar6)) &&
             (lVar7 = mkvparser::Block::GetTrackNumber(this), lVar7 == webm_ctx->video_track_index))
          {
            lVar9 = 0;
            bVar3 = false;
            goto LAB_001240ba;
          }
          lVar9 = mkvparser::Cluster::GetNext(pCurr,local_60,&local_60);
          iVar5 = 3;
          if (local_60 != (BlockEntry *)0x0) {
            iVar6 = (*local_60->_vptr_BlockEntry[3])();
            bVar3 = true;
            if (iVar6 != 0) goto LAB_001240ba;
          }
          bVar4 = true;
        }
      }
      else {
LAB_001240a8:
        lVar9 = mkvparser::Cluster::GetFirst(pCurr,&local_60);
        bVar3 = true;
LAB_001240ba:
        iVar5 = 1;
        if (local_60 == (BlockEntry *)0x0 || lVar9 != 0) {
LAB_001240d4:
          local_54 = -1;
        }
        else {
          if (bVar3) {
            iVar6 = (*local_60->_vptr_BlockEntry[2])();
            this = (Block *)CONCAT44(extraout_var,iVar6);
            if (this == (Block *)0x0) {
              this = (Block *)0x0;
              goto LAB_001240d4;
            }
            webm_ctx->block_frame_index = 0;
          }
          iVar5 = 0;
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) {
        return local_54;
      }
    } while ((bVar4) ||
            (lVar7 = mkvparser::Block::GetTrackNumber(this), lVar7 != webm_ctx->video_track_index));
    webm_ctx->cluster = pCurr;
    webm_ctx->block_entry = local_60;
    webm_ctx->block = this;
    this_00 = mkvparser::Block::GetFrame(this,webm_ctx->block_frame_index);
    ppuVar2 = local_40;
    psVar1 = local_48;
    webm_ctx->block_frame_index = webm_ctx->block_frame_index + 1;
    if ((long)*local_48 < this_00->len) {
      if (*local_40 != (uint8_t *)0x0) {
        operator_delete__(*local_40);
      }
      uVar10 = 0xffffffffffffffff;
      if (-1 < this_00->len) {
        uVar10 = this_00->len;
      }
      puVar8 = (uint8_t *)operator_new__(uVar10);
      *ppuVar2 = puVar8;
      webm_ctx->buffer = puVar8;
      if (*ppuVar2 == (uint8_t *)0x0) {
        return -1;
      }
      *psVar1 = this_00->len;
    }
    *local_50 = this_00->len;
    lVar7 = mkvparser::Block::GetTime(this,pCurr);
    webm_ctx->timestamp_ns = lVar7;
    bVar4 = mkvparser::Block::IsKey(this);
    webm_ctx->is_key_frame = (uint)bVar4;
    lVar9 = mkvparser::Block::Frame::Read(this_00,(IMkvReader *)webm_ctx->reader,*ppuVar2);
    iVar5 = -(uint)(lVar9 != 0);
  }
  return iVar5;
}

Assistant:

int webm_read_frame(struct WebmInputContext *webm_ctx, uint8_t **buffer,
                    size_t *bytes_read, size_t *buffer_size) {
  assert(webm_ctx->buffer == *buffer);
  // This check is needed for frame parallel decoding, in which case this
  // function could be called even after it has reached end of input stream.
  if (webm_ctx->reached_eos) {
    return 1;
  }
  mkvparser::Segment *const segment =
      reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
  const mkvparser::Cluster *cluster =
      reinterpret_cast<const mkvparser::Cluster *>(webm_ctx->cluster);
  const mkvparser::Block *block =
      reinterpret_cast<const mkvparser::Block *>(webm_ctx->block);
  const mkvparser::BlockEntry *block_entry =
      reinterpret_cast<const mkvparser::BlockEntry *>(webm_ctx->block_entry);
  bool block_entry_eos = false;
  do {
    long status = 0;
    bool get_new_block = false;
    if (block_entry == NULL && !block_entry_eos) {
      status = cluster->GetFirst(block_entry);
      get_new_block = true;
    } else if (block_entry_eos || block_entry->EOS()) {
      cluster = segment->GetNext(cluster);
      if (cluster == NULL || cluster->EOS()) {
        *bytes_read = 0;
        webm_ctx->reached_eos = 1;
        return 1;
      }
      status = cluster->GetFirst(block_entry);
      block_entry_eos = false;
      get_new_block = true;
    } else if (block == NULL ||
               webm_ctx->block_frame_index == block->GetFrameCount() ||
               block->GetTrackNumber() != webm_ctx->video_track_index) {
      status = cluster->GetNext(block_entry, block_entry);
      if (block_entry == NULL || block_entry->EOS()) {
        block_entry_eos = true;
        continue;
      }
      get_new_block = true;
    }
    if (status || block_entry == NULL) {
      return -1;
    }
    if (get_new_block) {
      block = block_entry->GetBlock();
      if (block == NULL) return -1;
      webm_ctx->block_frame_index = 0;
    }
  } while (block_entry_eos ||
           block->GetTrackNumber() != webm_ctx->video_track_index);

  webm_ctx->cluster = cluster;
  webm_ctx->block_entry = block_entry;
  webm_ctx->block = block;

  const mkvparser::Block::Frame &frame =
      block->GetFrame(webm_ctx->block_frame_index);
  ++webm_ctx->block_frame_index;
  if (frame.len > static_cast<long>(*buffer_size)) {
    delete[] * buffer;
    *buffer = new uint8_t[frame.len];
    webm_ctx->buffer = *buffer;
    if (*buffer == NULL) {
      return -1;
    }
    *buffer_size = frame.len;
  }
  *bytes_read = frame.len;
  webm_ctx->timestamp_ns = block->GetTime(cluster);
  webm_ctx->is_key_frame = block->IsKey();

  mkvparser::MkvReader *const reader =
      reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
  return frame.Read(reader, *buffer) ? -1 : 0;
}